

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zvgPort.c
# Opt level: O0

uint zvgSppPutMem(uchar *ss,uint len)

{
  uint local_18;
  uint local_14;
  uint err;
  uint len_local;
  uchar *ss_local;
  
  local_18 = 0;
  local_14 = len;
  _err = ss;
  do {
    if (local_14 == 0) {
      return local_18;
    }
    local_18 = zvgSppPutc(*_err);
    local_14 = local_14 - 1;
    _err = _err + 1;
  } while (local_18 == 0);
  return local_18;
}

Assistant:

uint zvgSppPutMem( uchar *ss, uint len)
{
	uint	err;

	err = errOk;

	while (len-- > 0)
	{	err = zvgSppPutc( *ss++);

		if (err)
			break;
	}
	return (err);
}